

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylnsymmat.cpp
# Opt level: O0

int __thiscall
TPZSkylNSymMatrix<float>::Subst_LForward(TPZSkylNSymMatrix<float> *this,TPZFMatrix<float> *B)

{
  int64_t iVar1;
  long lVar2;
  float **ppfVar3;
  float *col;
  TPZBaseMatrix *in_RSI;
  long *in_RDI;
  float *BPtr;
  float *end_ki;
  float *elem_ki;
  float sum;
  int64_t j;
  int64_t k;
  int64_t dimension;
  float *in_stack_ffffffffffffffb0;
  TPZFMatrix<float> *row;
  TPZFMatrix<float> *this_00;
  float local_34;
  long local_30;
  long local_28;
  int local_4;
  
  iVar1 = TPZBaseMatrix::Rows(in_RSI);
  lVar2 = (**(code **)(*in_RDI + 0x60))();
  if ((iVar1 == lVar2) && (((char)in_RDI[3] == '\x04' || ((char)in_RDI[3] == '\x01')))) {
    lVar2 = (**(code **)(*in_RDI + 0x60))();
    for (local_28 = 0; local_28 < lVar2; local_28 = local_28 + 1) {
      local_30 = 0;
      while( true ) {
        iVar1 = TPZBaseMatrix::Cols(in_RSI);
        if (iVar1 <= local_30) break;
        local_34 = 0.0;
        ppfVar3 = TPZVec<float_*>::operator[]((TPZVec<float_*> *)(in_RDI + 8),local_28);
        this_00 = (TPZFMatrix<float> *)(*ppfVar3 + 1);
        ppfVar3 = TPZVec<float_*>::operator[]((TPZVec<float_*> *)(in_RDI + 8),local_28 + 1);
        row = (TPZFMatrix<float> *)*ppfVar3;
        col = TPZFMatrix<float>::operator()(this_00,(int64_t)row,(int64_t)in_stack_ffffffffffffffb0)
        ;
        for (; this_00 < row;
            this_00 = (TPZFMatrix<float> *)
                      ((long)&(this_00->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable
                              ._vptr_TPZSavable + 4)) {
          local_34 = *(float *)&(this_00->super_TPZMatrix<float>).super_TPZBaseMatrix.
                                super_TPZSavable._vptr_TPZSavable * col[-1] + local_34;
          col = col + -1;
        }
        in_stack_ffffffffffffffb0 = TPZFMatrix<float>::operator()(this_00,(int64_t)row,(int64_t)col)
        ;
        *in_stack_ffffffffffffffb0 = *in_stack_ffffffffffffffb0 - local_34;
        local_30 = local_30 + 1;
      }
    }
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int TPZSkylNSymMatrix<TVar>::Subst_LForward(TPZFMatrix<TVar> *B)const
{
  if ((B->Rows() != this->Dim()) || (this->fDecomposed != ELDLt && this->fDecomposed != ELU))
    return(0);

  int64_t dimension = this->Dim();
  for (int64_t k = 0; k < dimension; k++)
  {
    for (int64_t j = 0; j < B->Cols(); j++)
    {
      // Faz sum = SOMA( A[k,i] * B[i,j] ), para i = 1, ..., k-1.
      //
      TVar sum = 0.0;
      TVar *elem_ki = fElemb[k] + 1;
      TVar *end_ki = fElemb[k + 1];
      TVar *BPtr = &(*B)(k, j);
      while (elem_ki < end_ki)
        sum += (*elem_ki++) * (*--BPtr);

      // Faz B[k,j] = (B[k,j] - sum) / A[k,k].
      //
      // B->PutVal( k, j, (B->GetVal(k, j) - sum) / row_k->pElem[0] );
      BPtr = &(*B)(k, j);
      *BPtr -= sum;
    }
  }
  return(1);
}